

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::RawBufferAsyncModificationRegister_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContextTTD *this;
  ScriptContext *pSVar1;
  Var aValue;
  ArrayBuffer *trgt;
  
  pSVar1 = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (pSVar1 == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == RawBufferAsyncModificationRegister) {
    aValue = InflateVarInReplay(executeContext,*(TTDVar *)(evt + 1));
    this = pSVar1->TTDContextInfo;
    trgt = Js::VarTo<Js::ArrayBuffer>(aValue);
    ScriptContextTTD::AddToAsyncPendingList(this,trgt,evt[2].EventKind);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void RawBufferAsyncModificationRegister_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTRawBufferModifyAction* action = GetInlineEventDataAs<JsRTRawBufferModifyAction, EventKind::RawBufferAsyncModificationRegister>(evt);
            Js::Var trgt = InflateVarInReplay(executeContext, action->Trgt); //never cross context

            ctx->TTDContextInfo->AddToAsyncPendingList(Js::VarTo<Js::ArrayBuffer>(trgt), action->Index);
        }